

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createQuadSphere
          (Vec3fa *center,float radius,size_t N,Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppQVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  iterator iVar5;
  undefined8 uVar6;
  Quad QVar7;
  Quad QVar8;
  Quad QVar9;
  uint uVar10;
  Node *pNVar11;
  int iVar12;
  QuadMeshNode *this;
  Vec3fa *pVVar13;
  int iVar14;
  long *in_RCX;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float phif;
  uint p00;
  Quad local_b0;
  float local_a0;
  float local_9c;
  ulong local_98;
  ulong local_90;
  int local_84;
  float local_80;
  float local_7c;
  Ref<embree::SceneGraph::MaterialNode> *local_78;
  QuadMeshNode *local_70;
  ulong local_68;
  Ref<embree::SceneGraph::MaterialNode> local_60;
  float local_58;
  uint local_54;
  ulong local_50;
  Node *local_48;
  ulong local_40;
  ulong local_38;
  
  local_9c = radius;
  local_78 = material;
  this = (QuadMeshNode *)operator_new(0xd8);
  local_60.ptr = (MaterialNode *)*in_RCX;
  local_70 = this;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this,&local_60,(BBox1f)0x3f80000000000000,1);
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  iVar14 = (int)local_78;
  uVar10 = iVar14 * 2;
  pvVar4 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar21 = (ulong)((iVar14 + 1) * uVar10);
  uVar18 = pvVar4->size_alloced;
  uVar15 = uVar18;
  if ((uVar18 < uVar21) && (uVar15 = uVar21, uVar18 != 0)) {
    while (uVar15 = uVar18, uVar15 < uVar21) {
      uVar18 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
    }
  }
  if (uVar21 < pvVar4->size_active) {
    pvVar4->size_active = uVar21;
  }
  local_48 = (Node *)center;
  if (pvVar4->size_alloced == uVar15) {
    pvVar4->size_active = uVar21;
  }
  else {
    ptr = pvVar4->items;
    pVVar13 = (Vec3fa *)alignedMalloc(uVar15 << 4,0x10);
    pvVar4->items = pVVar13;
    if (pvVar4->size_active != 0) {
      lVar16 = 0;
      uVar18 = 0;
      do {
        puVar3 = (undefined8 *)((long)&ptr->field_0 + lVar16);
        uVar6 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar16);
        *puVar2 = *puVar3;
        puVar2[1] = uVar6;
        uVar18 = uVar18 + 1;
        lVar16 = lVar16 + 0x10;
      } while (uVar18 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar21;
    pvVar4->size_alloced = uVar15;
  }
  fVar23 = (float)uVar10;
  auVar25 = rcpss(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
  fVar26 = (float)((ulong)local_78 & 0xffffffff);
  local_80 = (2.0 - fVar23 * auVar25._0_4_) * auVar25._0_4_;
  auVar24._4_4_ = in_XMM2_Db;
  auVar24._0_4_ = fVar26;
  auVar24._8_4_ = in_XMM2_Dc;
  auVar24._12_4_ = in_XMM2_Dd;
  auVar25._4_4_ = in_XMM2_Db;
  auVar25._0_4_ = fVar26;
  auVar25._8_4_ = in_XMM2_Dc;
  auVar25._12_4_ = in_XMM2_Dd;
  auVar25 = rcpss(auVar24,auVar25);
  local_58 = (2.0 - fVar26 * auVar25._0_4_) * auVar25._0_4_;
  local_38 = (ulong)(uVar10 - 1);
  local_70 = (QuadMeshNode *)&local_70->quads;
  local_54 = uVar10 * (int)local_78;
  local_68 = (ulong)(uint)(iVar14 * -2);
  local_84 = 0;
  lVar16 = 0;
  uVar18 = 0;
  local_50 = local_68;
  local_40 = (ulong)uVar10;
  do {
    uVar15 = local_40;
    local_98 = uVar18;
    if (uVar10 != 0) {
      local_90 = CONCAT44(local_90._4_4_,(float)uVar18 * 3.1415927 * local_58);
      uVar18 = 0;
      do {
        local_7c = ((float)(uVar18 & 0xffffffff) + (float)(uVar18 & 0xffffffff)) * 3.1415927 *
                   local_80;
        fVar23 = *(float *)N;
        local_a0 = sinf((float)local_90);
        local_a0 = local_a0 * local_9c;
        fVar26 = sinf(local_7c);
        uVar19 = (int)uVar18 + (int)lVar16;
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar19].field_0.m128[0] =
             fVar26 * local_a0 + fVar23;
        fVar23 = *(float *)(N + 4);
        fVar26 = cosf((float)local_90);
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar19].field_0.m128[1] =
             fVar26 * local_9c + fVar23;
        fVar23 = *(float *)(N + 8);
        local_a0 = sinf((float)local_90);
        local_a0 = local_a0 * local_9c;
        fVar26 = cosf(local_7c);
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar19].field_0.m128[2] =
             fVar26 * local_a0 + fVar23;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
    }
    if ((int)local_98 != 0) {
      uVar19 = (uint)local_38;
      if ((int)local_98 == 1) {
        if (uVar10 != 0) {
          iVar14 = 1;
          do {
            local_b0.v0 = iVar14 + uVar19;
            iVar12 = iVar14;
            if ((int)local_50 + iVar14 == 0) {
              iVar12 = 0;
            }
            local_b0.v2 = iVar12 + uVar10;
            iVar5._M_current =
                 (this->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_b0.v1 = uVar19;
            local_b0.v3 = local_b0.v2;
            if (iVar5._M_current ==
                (this->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                        ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)local_70,iVar5,&local_b0);
            }
            else {
              QVar7.v1 = uVar19;
              QVar7.v0 = local_b0.v0;
              QVar7.v2 = local_b0.v2;
              QVar7.v3 = local_b0.v2;
              *iVar5._M_current = QVar7;
              ppQVar1 = &(this->quads).
                         super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppQVar1 = *ppQVar1 + 1;
            }
            iVar12 = (int)local_50 + iVar14;
            iVar14 = iVar14 + 1;
          } while (iVar12 != 0);
        }
      }
      else if ((int)local_98 == (uint)local_78) {
        if (uVar10 != 0) {
          iVar14 = (int)local_98 + -1;
          uVar20 = 0;
          do {
            local_b0.v1 = (int)local_68 + uVar20;
            bVar22 = uVar19 == uVar20;
            uVar20 = uVar20 + 1;
            local_b0.v2 = uVar20;
            if (bVar22) {
              local_b0.v2 = 0;
            }
            local_b0.v2 = local_b0.v2 + iVar14 * uVar10;
            local_b0.v0 = local_54;
            iVar5._M_current =
                 (this->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_b0.v3 = local_b0.v2;
            if (iVar5._M_current ==
                (this->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                        ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)local_70,iVar5,&local_b0);
            }
            else {
              QVar8.v1 = local_b0.v1;
              QVar8.v0 = local_54;
              QVar8.v2 = local_b0.v2;
              QVar8.v3 = local_b0.v2;
              *iVar5._M_current = QVar8;
              ppQVar1 = &(this->quads).
                         super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppQVar1 = *ppQVar1 + 1;
            }
          } while (uVar10 != uVar20);
        }
      }
      else if (uVar10 != 0) {
        local_90 = (ulong)(((int)local_98 + -1) * uVar10);
        iVar14 = (int)local_98 * uVar10;
        uVar20 = 0;
        do {
          uVar17 = uVar20 + 1;
          local_b0.v1 = (int)local_68 + uVar20;
          local_b0.v3 = uVar17;
          if (uVar19 == uVar20) {
            local_b0.v3 = 0;
          }
          local_b0.v2 = (int)local_90 + local_b0.v3;
          local_b0.v0 = uVar20 + local_84;
          local_b0.v3 = local_b0.v3 + iVar14;
          iVar5._M_current =
               (this->quads).
               super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->quads).
              super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                      ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                        *)local_70,iVar5,&local_b0);
          }
          else {
            QVar9.v1 = local_b0.v1;
            QVar9.v0 = local_b0.v0;
            QVar9.v2 = local_b0.v2;
            QVar9.v3 = local_b0.v3;
            *iVar5._M_current = QVar9;
            ppQVar1 = &(this->quads).
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppQVar1 = *ppQVar1 + 1;
          }
          uVar20 = uVar17;
        } while (uVar10 != uVar17);
      }
    }
    pNVar11 = local_48;
    uVar19 = (int)local_98 + 1;
    uVar18 = (ulong)uVar19;
    lVar16 = lVar16 + local_40;
    local_68 = (ulong)((int)local_68 + uVar10);
    local_84 = local_84 + uVar10;
  } while (uVar19 <= (uint)local_78);
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this;
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  (*(this->super_Node).super_RefCount._vptr_RefCount[3])(this);
  return (Ref<embree::SceneGraph::Node>)pNVar11;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p11,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p11));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }